

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O0

void __thiscall nv::ColorBlock::boundsRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  Color32 CVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Color32 local_30;
  uint local_2c;
  Color32 inset;
  uint i;
  Color32 maxColor;
  Color32 minColor;
  Color32 *end_local;
  Color32 *start_local;
  ColorBlock *this_local;
  
  _maxColor = &end->field_0;
  Color32::Color32((Color32 *)&i,0xff,0xff,0xff);
  Color32::Color32(&inset,'\0','\0','\0');
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    if (this->m_color[local_2c].field_0.field_0.r < i._2_1_) {
      i._0_3_ = CONCAT12(this->m_color[local_2c].field_0.field_0.r,(undefined2)i);
    }
    if (this->m_color[local_2c].field_0.field_0.g < i._1_1_) {
      i._0_2_ = CONCAT11(this->m_color[local_2c].field_0.field_0.g,(byte)i);
    }
    if (this->m_color[local_2c].field_0.field_0.b < (byte)i) {
      i = CONCAT31(i._1_3_,this->m_color[local_2c].field_0.field_0.b);
    }
    if (inset.field_0.field_0.r < this->m_color[local_2c].field_0.field_0.r) {
      inset.field_0.field_0.r = this->m_color[local_2c].field_0.field_0.r;
    }
    if (inset.field_0.field_0.g < this->m_color[local_2c].field_0.field_0.g) {
      inset.field_0.field_0.g = this->m_color[local_2c].field_0.field_0.g;
    }
    if (inset.field_0.field_0.b < this->m_color[local_2c].field_0.field_0.b) {
      inset.field_0.field_0.b = this->m_color[local_2c].field_0.field_0.b;
    }
  }
  Color32::Color32(&local_30);
  uVar2 = i;
  CVar1 = inset;
  uVar8 = (int)((uint)inset.field_0.field_0.r - (uint)i._2_1_) >> 4;
  bVar3 = (byte)uVar8;
  uVar9 = (int)(((uint)inset.field_0 >> 8 & 0xff) - (i >> 8 & 0xff)) >> 4;
  bVar4 = (byte)uVar9;
  uVar10 = (int)(((uint)inset.field_0 & 0xff) - (i & 0xff)) >> 4;
  bVar5 = (byte)uVar10;
  if ((uint)i._2_1_ + (uVar8 & 0xff) < 0x100) {
    cVar6 = i._2_1_ + bVar3;
  }
  else {
    cVar6 = -1;
  }
  if ((uint)i._1_1_ + (uVar9 & 0xff) < 0x100) {
    cVar7 = i._1_1_ + bVar4;
  }
  else {
    cVar7 = -1;
  }
  i._0_2_ = CONCAT11(cVar7,(byte)i);
  i = CONCAT22(CONCAT11(i._3_1_,cVar6),(undefined2)i);
  if ((uVar2 & 0xff) + (uVar10 & 0xff) < 0x100) {
    cVar6 = (byte)i + bVar5;
  }
  else {
    cVar6 = -1;
  }
  i = CONCAT31(i._1_3_,cVar6);
  if (inset.field_0.field_0.r < bVar3) {
    cVar6 = '\0';
  }
  else {
    cVar6 = inset.field_0.field_0.r - bVar3;
  }
  inset.field_0.field_0.r = cVar6;
  inset.field_0.field_0.g = CVar1.field_0._1_1_;
  if (inset.field_0.field_0.g < bVar4) {
    inset.field_0.field_0.g = '\0';
  }
  else {
    inset.field_0.field_0.g = inset.field_0.field_0.g - bVar4;
  }
  inset.field_0.field_0.b = CVar1.field_0._0_1_;
  if (inset.field_0.field_0.b < bVar5) {
    cVar6 = '\0';
  }
  else {
    cVar6 = inset.field_0.field_0.b - bVar5;
  }
  inset.field_0.field_0.b = cVar6;
  (start->field_0).u = i;
  _maxColor->field_0 =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0)inset.field_0;
  return;
}

Assistant:

void ColorBlock::boundsRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);

	Color32 minColor(255, 255, 255);
	Color32 maxColor(0, 0, 0);

	for(uint i = 0; i < 16; i++)
	{
		if (m_color[i].r < minColor.r) { minColor.r = m_color[i].r; }
		if (m_color[i].g < minColor.g) { minColor.g = m_color[i].g; }
		if (m_color[i].b < minColor.b) { minColor.b = m_color[i].b; }
		if (m_color[i].r > maxColor.r) { maxColor.r = m_color[i].r; }
		if (m_color[i].g > maxColor.g) { maxColor.g = m_color[i].g; }
		if (m_color[i].b > maxColor.b) { maxColor.b = m_color[i].b; }
	}

	// Offset range by 1/16 of the extents
	Color32 inset;
	inset.r = (maxColor.r - minColor.r) >> 4;
	inset.g = (maxColor.g - minColor.g) >> 4;
	inset.b = (maxColor.b - minColor.b) >> 4;

	minColor.r = (minColor.r + inset.r <= 255) ? minColor.r + inset.r : 255;
	minColor.g = (minColor.g + inset.g <= 255) ? minColor.g + inset.g : 255;
	minColor.b = (minColor.b + inset.b <= 255) ? minColor.b + inset.b : 255;

	maxColor.r = (maxColor.r >= inset.r) ? maxColor.r - inset.r : 0;
	maxColor.g = (maxColor.g >= inset.g) ? maxColor.g - inset.g : 0;
	maxColor.b = (maxColor.b >= inset.b) ? maxColor.b - inset.b : 0;

	*start = minColor;
	*end = maxColor;
}